

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

void VP8InitDithering(WebPDecoderOptions *options,VP8Decoder *dec)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  if (options == (WebPDecoderOptions *)0x0) {
    return;
  }
  uVar4 = options->dithering_strength;
  if (-1 < (int)uVar4) {
    uVar2 = 0xff;
    if (uVar4 < 0x65) {
      if (uVar4 == 0) goto LAB_001049fd;
      uVar2 = (uVar4 * 0xff & 0xffff) / 100;
    }
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar6 = *(uint *)((long)dec->dqm[0].uv_mat + lVar5 + 8);
      if ((int)uVar6 < 0xc) {
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        uVar6 = "\b\a\x06\x04\x04\x02\x02\x02\x01\x01\x01\x01"[uVar6] * uVar2 >> 3;
        *(uint *)((long)dec->dqm[0].uv_mat + lVar5 + 0xc) = uVar6;
      }
      else {
        uVar6 = *(uint *)((long)dec->dqm[0].uv_mat + lVar5 + 0xc);
      }
      uVar4 = uVar4 | uVar6;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x80);
    if (uVar4 != 0) {
      VP8InitRandom(&dec->dithering_rg,1.0);
      dec->dither = 1;
    }
  }
LAB_001049fd:
  iVar1 = options->alpha_dithering_strength;
  dec->alpha_dithering = iVar1;
  iVar3 = 100;
  if (iVar1 < 0x65) {
    if (-1 < iVar1) {
      return;
    }
    iVar3 = 0;
  }
  dec->alpha_dithering = iVar3;
  return;
}

Assistant:

void VP8InitDithering(const WebPDecoderOptions* const options,
                      VP8Decoder* const dec) {
  assert(dec != NULL);
  if (options != NULL) {
    const int d = options->dithering_strength;
    const int max_amp = (1 << VP8_RANDOM_DITHER_FIX) - 1;
    const int f = (d < 0) ? 0 : (d > 100) ? max_amp : (d * max_amp / 100);
    if (f > 0) {
      int s;
      int all_amp = 0;
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8QuantMatrix* const dqm = &dec->dqm[s];
        if (dqm->uv_quant < DITHER_AMP_TAB_SIZE) {
          const int idx = (dqm->uv_quant < 0) ? 0 : dqm->uv_quant;
          dqm->dither = (f * kQuantToDitherAmp[idx]) >> 3;
        }
        all_amp |= dqm->dither;
      }
      if (all_amp != 0) {
        VP8InitRandom(&dec->dithering_rg, 1.0f);
        dec->dither = 1;
      }
    }
    // potentially allow alpha dithering
    dec->alpha_dithering = options->alpha_dithering_strength;
    if (dec->alpha_dithering > 100) {
      dec->alpha_dithering = 100;
    } else if (dec->alpha_dithering < 0) {
      dec->alpha_dithering = 0;
    }
  }
}